

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void primary(Vm *vm)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  Vm *pVVar4;
  uint8_t arg;
  uint8_t first;
  _Bool _Var5;
  uint32_t uVar6;
  Compiler *compiler_00;
  ulong uVar7;
  OP_CODE op_code;
  double value;
  undefined1 auVar8 [16];
  CrispyValue value_00;
  CrispyValue CVar9;
  undefined8 uStack_160;
  char acStack_158 [8];
  char *local_150;
  Vm *local_148;
  char *local_140;
  Vm *local_138;
  ulong local_130;
  Token local_128;
  Token local_108;
  Token local_e8;
  undefined1 local_c4 [8];
  Variable var;
  uint8_t index_2_1;
  uint8_t index_1_1;
  uint16_t pos_1;
  uint64_t res_1;
  unsigned_long __vla_expr1;
  size_t length_1;
  uint8_t index_2;
  uint8_t index_1;
  uint16_t pos;
  double res;
  unsigned_long __vla_expr0;
  size_t length;
  Token token;
  Compiler *compiler;
  Vm *vm_local;
  
  compiler_00 = &vm->compiler;
  local_130 = (ulong)(compiler_00->token).type;
  switch(local_130) {
  case 0:
    uStack_160 = 0x109096;
    advance(vm);
    uStack_160 = 0x10909f;
    expr(vm);
    if ((vm->compiler).token.type != TOKEN_CLOSE_PAREN) {
      uStack_160 = 0x1090c3;
      error(&vm->compiler,"Expected \')\'");
    }
    break;
  default:
    uStack_160 = 0x109346;
    error(&vm->compiler,"Unexpected Token");
    break;
  case 2:
    if ((vm->compiler).token.length == 1) {
      if (*(vm->compiler).token.start == '0') {
        uStack_160 = 0x108e1f;
        emit_no_arg(vm,OP_LDC_0);
        break;
      }
      if (*(vm->compiler).token.start == '1') {
        uStack_160 = 0x108e42;
        emit_no_arg(vm,OP_LDC_1);
        break;
      }
    }
    sVar1 = (vm->compiler).token.length;
    lVar3 = -(sVar1 + 0x10 & 0xfffffffffffffff0);
    pcVar2 = (vm->compiler).token.start;
    local_140 = acStack_158 + lVar3;
    *(undefined8 *)((long)&uStack_160 + lVar3) = 0x108e95;
    memcpy(acStack_158 + lVar3,pcVar2,sVar1);
    pcVar2 = local_140;
    local_140[sVar1] = '\0';
    *(undefined8 *)((long)&uStack_160 + lVar3) = 0x108ead;
    value = strtod(pcVar2,(char **)0x0);
    local_138 = vm;
    *(undefined8 *)((long)&uStack_160 + lVar3) = 0x108ec7;
    CVar9 = create_number(value);
    pVVar4 = local_138;
    value_00.field_1 = CVar9.field_1;
    value_00._4_4_ = 0;
    value_00.type = CVar9.type;
    *(undefined8 *)((long)&uStack_160 + lVar3) = 0x108ee1;
    uVar6 = add_constant(pVVar4,value_00);
    if ((ushort)uVar6 < 0x100) {
      *(undefined8 *)((long)&uStack_160 + lVar3) = 0x108f35;
      emit_byte_arg(vm,OP_LDC,(uint8_t)uVar6);
    }
    else {
      *(undefined8 *)((long)&uStack_160 + lVar3) = 0x108f1e;
      emit_short_arg(vm,OP_LDC_W,(uint8_t)(uVar6 >> 8),(uint8_t)uVar6);
    }
    break;
  case 3:
    sVar1 = (vm->compiler).token.length;
    lVar3 = -(sVar1 + 0x10 & 0xfffffffffffffff0);
    pcVar2 = (vm->compiler).token.start;
    local_150 = acStack_158 + lVar3;
    *(undefined8 *)((long)&uStack_160 + lVar3) = 0x108f8e;
    memcpy(acStack_158 + lVar3,pcVar2,sVar1);
    pcVar2 = local_150;
    local_150[sVar1] = '\0';
    *(undefined8 *)((long)&uStack_160 + lVar3) = 0x108fab;
    uVar7 = strtoul(pcVar2,(char **)0x0,0x10);
    auVar8._8_4_ = (int)(uVar7 >> 0x20);
    auVar8._0_8_ = uVar7;
    auVar8._12_4_ = 0x45300000;
    local_148 = vm;
    *(undefined8 *)((long)&uStack_160 + lVar3) = 0x108fec;
    CVar9 = create_number((auVar8._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0));
    pVVar4 = local_148;
    var._12_4_ = CVar9.type;
    CVar9._4_4_ = 0;
    CVar9.type = var._12_4_;
    *(undefined8 *)((long)&uStack_160 + lVar3) = 0x109012;
    uVar6 = add_constant(pVVar4,CVar9);
    arg = (uint8_t)uVar6;
    if ((ushort)uVar6 < 0x100) {
      *(undefined8 *)((long)&uStack_160 + lVar3) = 0x109081;
      emit_byte_arg(vm,OP_LDC,arg);
    }
    else {
      first = (uint8_t)(uVar6 >> 8);
      var.frame_offset._2_1_ = arg;
      var.frame_offset._3_1_ = first;
      *(undefined8 *)((long)&uStack_160 + lVar3) = 0x109067;
      emit_short_arg(vm,OP_LDC_W,first,arg);
    }
    break;
  case 4:
    uStack_160 = 0x1092fd;
    string(vm,true);
    break;
  case 0xf:
    uStack_160 = 0x1090e1;
    _local_c4 = resolve_var(vm,(vm->compiler).token.start,(vm->compiler).token.length);
    if (var.index == vm->frame_count) {
      uStack_160 = 0x10913f;
      emit_byte_arg(vm,OP_LOAD,local_c4[0]);
      uStack_160 = 0x109148;
      advance(vm);
      if (((compiler_00->token).type != TOKEN_PLUS_PLUS) &&
         ((compiler_00->token).type != TOKEN_MINUS_MINUS)) {
        return;
      }
      uStack_160 = 0x109163;
      advance(vm);
      if (((undefined1  [16])_local_c4 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        uStack_160 = 0x10917c;
        error(compiler_00,"Cannot increment value");
      }
      op_code = OP_DEC_1;
      if ((vm->compiler).previous.type == TOKEN_PLUS_PLUS) {
        op_code = OP_INC_1;
      }
      uStack_160 = 0x1091a5;
      emit_byte_arg(vm,op_code,local_c4[0]);
      return;
    }
    uStack_160 = 0x109123;
    emit_short_arg(vm,OP_LOAD_OFFSET,local_c4[8],local_c4[0]);
    break;
  case 0x16:
    uStack_160 = 0x109228;
    advance(vm);
    if (((vm->compiler).next.type != TOKEN_COLON) &&
       ((compiler_00->token).type != TOKEN_CLOSE_BRACE)) {
      return;
    }
    uStack_160 = 0x10924d;
    emit_no_arg(vm,OP_DICT_NEW);
    uStack_160 = 0x10925b;
    _Var5 = check(vm,TOKEN_CLOSE_BRACE);
    if (!_Var5) {
      uStack_160 = 0x10926d;
      _Var5 = check(vm,TOKEN_EOF);
      if (!_Var5) {
        do {
          uStack_160 = 0x109281;
          string(vm,true);
          uStack_160 = 0x10928a;
          advance(vm);
          uStack_160 = 0x1092a6;
          consume(&local_108,vm,TOKEN_COLON,"Expected \':\' between key and value in dictionary");
          uStack_160 = 0x1092af;
          expr(vm);
          uStack_160 = 0x1092bd;
          emit_no_arg(vm,OP_STRUCT_SET);
          uStack_160 = 0x1092cb;
          _Var5 = match(vm,TOKEN_COMMA);
        } while (_Var5);
      }
    }
    uStack_160 = 0x1092ed;
    consume(&local_128,vm,TOKEN_CLOSE_BRACE,"Expected \'}\' after dictionary literal");
    return;
  case 0x1e:
    uStack_160 = 0x10931d;
    emit_no_arg(vm,OP_TRUE);
    break;
  case 0x1f:
    uStack_160 = 0x10930d;
    emit_no_arg(vm,OP_FALSE);
    break;
  case 0x20:
    uStack_160 = 0x10932d;
    emit_no_arg(vm,OP_NIL);
    break;
  case 0x2a:
    uStack_160 = 0x1091b8;
    emit_no_arg(vm,OP_LIST_NEW);
    uStack_160 = 0x1091c1;
    advance(vm);
    uStack_160 = 0x1091cf;
    _Var5 = match(vm,TOKEN_CLOSE_BRACKET);
    if (_Var5) {
      return;
    }
    do {
      uStack_160 = 0x1091de;
      expr(vm);
      uStack_160 = 0x1091ec;
      emit_no_arg(vm,OP_LIST_APPEND);
      uStack_160 = 0x1091fa;
      _Var5 = match(vm,TOKEN_COMMA);
    } while (_Var5);
    uStack_160 = 0x10921a;
    consume(&local_e8,vm,TOKEN_CLOSE_BRACKET,"Expected \']\' after list literal");
    return;
  }
  uStack_160 = 0x10934f;
  advance(vm);
  return;
}

Assistant:

static void primary(Vm *vm) {
    Compiler *compiler = &vm->compiler;

    switch (compiler->token.type) {
        case TOKEN_DEC_NUMBER: {
            Token token = compiler->token;
            if (token.length == 1) {
                if (*token.start == '0') {
                    emit_no_arg(vm, OP_LDC_0);
                    break;
                } else if (*compiler->token.start == '1') {
                    emit_no_arg(vm, OP_LDC_1);
                    break;
                }
            }

            size_t length = compiler->token.length;
            char str[length + 1];
            memcpy(str, compiler->token.start, length);
            str[length] = '\0';
            double res;

            res = strtod(str, NULL);
            uint16_t pos = (uint16_t) add_constant(vm, create_number(res));

            if (pos > 255) {
                uint8_t index_1 = (uint8_t) (pos >> 8);
                uint8_t index_2 = (uint8_t) (pos & 0xFF);
                emit_short_arg(vm, OP_LDC_W, index_1, index_2);
            } else {
                emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
            }

            break;
        }
        case TOKEN_HEX_NUMBER: {
            size_t length = compiler->token.length;
            char str[length + 1];
            memcpy(str, compiler->token.start, length);
            str[length] = '\0';
            uint64_t res;

            res = strtoul(str, NULL, 16);
            uint16_t pos = (uint16_t) add_constant(vm, create_number(res));

            if (pos > 255) {
                uint8_t index_1 = (uint8_t) (pos >> 8);
                uint8_t index_2 = (uint8_t) (pos & 0xFF);
                emit_short_arg(vm, OP_LDC_W, index_1, index_2);
            } else {
                emit_byte_arg(vm, OP_LDC, (uint8_t) pos);
            }

            break;
        }
        case TOKEN_OPEN_PAREN: {
            advance(vm);
            expr(vm);
            if (vm->compiler.token.type != TOKEN_CLOSE_PAREN) {
                error(&vm->compiler, "Expected ')'");
            }
            break;
        }
        case TOKEN_IDENTIFIER: {
            Variable var = resolve_var(vm, compiler->token.start, compiler->token.length);
            if (var.frame_offset != vm->frame_count) {
                // TODO bigger numbers
                emit_short_arg(vm, OP_LOAD_OFFSET, (uint8_t) var.frame_offset, (uint8_t) var.index);
                break;
            }
            emit_byte_arg(vm, OP_LOAD, (uint8_t) var.index);

            advance(vm);

            if (compiler->token.type == TOKEN_PLUS_PLUS || compiler->token.type == TOKEN_MINUS_MINUS) {
                advance(vm);

                if (!var.assignable) {
                    error(compiler, "Cannot increment value");
                }

                // TODO bigger numbers
                emit_byte_arg(vm, compiler->previous.type == TOKEN_PLUS_PLUS ? OP_INC_1 : OP_DEC_1,
                              (uint8_t) var.index);
            }

            // already advanced
            return;
        }
        case TOKEN_OPEN_BRACKET: {
            emit_no_arg(vm, OP_LIST_NEW);
            advance(vm);

            if (!match(vm, TOKEN_CLOSE_BRACKET)) {
                do {
                    expr(vm);
                    emit_no_arg(vm, OP_LIST_APPEND);
                } while (match(vm, TOKEN_COMMA));

                consume(vm, TOKEN_CLOSE_BRACKET, "Expected ']' after list literal");
            }
            return;
        }
        case TOKEN_OPEN_BRACE: {
            advance(vm);
            // a dictionary, not a block
            if (compiler->next.type == TOKEN_COLON || compiler->token.type == TOKEN_CLOSE_BRACE) {
                emit_no_arg(vm, OP_DICT_NEW);

                if (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
                    do {
                        // consume key
                        string(vm, true);
                        advance(vm);
                        consume(vm, TOKEN_COLON, "Expected ':' between key and value in dictionary");
                        // consume value
                        expr(vm);

                        emit_no_arg(vm, OP_STRUCT_SET);
                    } while (match(vm, TOKEN_COMMA));
                }

                consume(vm, TOKEN_CLOSE_BRACE, "Expected '}' after dictionary literal");
            }

            return;
        }
        case TOKEN_STRING: {
            string(vm, true);
            break;
        }
        case TOKEN_FALSE:
            emit_no_arg(vm, OP_FALSE);
            break;
        case TOKEN_TRUE:
            emit_no_arg(vm, OP_TRUE);
            break;
        case TOKEN_NIL:
            emit_no_arg(vm, OP_NIL);
            break;
        default:
            error(&vm->compiler, "Unexpected Token");
            break;
    }

    advance(vm);
}